

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint32_t google::protobuf::internal::DecodeTwoBytes(char **ptr)

{
  unsigned_short uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t x;
  uint32_t value;
  char **ptr_local;
  
  uVar1 = UnalignedLoad<unsigned_short>(*ptr);
  uVar2 = (uint)(char)uVar1;
  uVar3 = uVar2 + (uVar2 & uVar1);
  iVar4 = 1;
  if (uVar3 < uVar2) {
    iVar4 = 2;
  }
  *ptr = *ptr + iVar4;
  return uVar3;
}

Assistant:

inline uint32_t DecodeTwoBytes(const char** ptr) {
  uint32_t value = UnalignedLoad<uint16_t>(*ptr);
  // Sign extend the low byte continuation bit
  uint32_t x = static_cast<int8_t>(value);
  value &= x;  // Mask out the high byte iff no continuation
  // This add is an amazing operation, it cancels the low byte continuation bit
  // from y transferring it to the carry. Simultaneously it also shifts the 7
  // LSB left by one tightly against high byte varint bits. Hence value now
  // contains the unpacked value shifted left by 1.
  value += x;
  // Use the carry to update the ptr appropriately.
  *ptr += value < x ? 2 : 1;
  return value;
}